

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_create_ghosts_config
                  (Integer type,Integer ndim,Integer *dims,Integer *width,char *array_name,
                  Integer *chunk,Integer p_handle,Integer *g_a)

{
  Integer g_a_00;
  logical lVar1;
  
  g_a_00 = pnga_create_handle();
  *g_a = g_a_00;
  pnga_set_data(g_a_00,ndim,dims,type);
  pnga_set_ghosts(g_a_00,width);
  pnga_set_array_name(g_a_00,array_name);
  pnga_set_chunk(g_a_00,chunk);
  pnga_set_pgroup(g_a_00,p_handle);
  lVar1 = pnga_allocate(g_a_00);
  return lVar1;
}

Assistant:

logical pnga_create_ghosts_config(Integer type,
                   Integer ndim,
                   Integer dims[],
                   Integer width[],
                   char* array_name,
                   Integer chunk[],
                   Integer p_handle,
                   Integer *g_a)
{
  logical status;
  Integer g_A;
  g_A = pnga_create_handle();
  *g_a = g_A;
  pnga_set_data(g_A,ndim,dims,type);
  pnga_set_ghosts(g_A,width);
  pnga_set_array_name(g_A,array_name);
  pnga_set_chunk(g_A,chunk);
  pnga_set_pgroup(g_A,p_handle);
  status = pnga_allocate(g_A);
  return status;
}